

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  std::operator<<((ostream *)&std::cout,
                  "#include \"google/protobuf/compiler/js/well_known_types_embed.h\"\n");
  std::operator<<((ostream *)&std::cout,"struct FileToc well_known_types_js[] = {\n");
  for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
    AddFile(argv[local_1c],(basic_ostream<char,_std::char_traits<char>_> *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"  {NULL, NULL}  // Terminate the list.\n");
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  std::cout << "#include "
               "\"google/protobuf/compiler/js/well_known_types_embed.h\"\n";
  std::cout << "struct FileToc well_known_types_js[] = {\n";

  for (int i = 1; i < argc; i++) {
    AddFile(argv[i], &std::cout);
  }

  std::cout << "  {NULL, NULL}  // Terminate the list.\n";
  std::cout << "};\n";

  return EXIT_SUCCESS;
}